

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh_curve25519.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  char *__format;
  char pers [5];
  uchar srv_to_cli [32];
  uchar cli_to_srv [32];
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_ecdh_context ctx_srv;
  mbedtls_ecdh_context ctx_cli;
  mbedtls_entropy_context entropy;
  uchar local_aa0 [8];
  uchar local_a98 [32];
  uchar local_a78 [40];
  mbedtls_ctr_drbg_context local_a50;
  mbedtls_ecdh_context local_8f8;
  mbedtls_ecdh_context local_690;
  mbedtls_entropy_context local_428;
  
  builtin_memcpy(local_aa0,"ecdh",5);
  mbedtls_ecdh_init(&local_690);
  mbedtls_ecdh_init(&local_8f8);
  mbedtls_ctr_drbg_init(&local_a50);
  printf("  . Seeding the random number generator...");
  fflush(_stdout);
  mbedtls_entropy_init(&local_428);
  uVar1 = mbedtls_ctr_drbg_seed(&local_a50,mbedtls_entropy_func,&local_428,local_aa0,5);
  if (uVar1 == 0) {
    puts(" ok");
    printf("  . Setting up client context...");
    fflush(_stdout);
    uVar1 = mbedtls_ecp_group_load(&local_690.grp,MBEDTLS_ECP_DP_CURVE25519);
    if (uVar1 == 0) {
      uVar1 = mbedtls_ecdh_gen_public
                        (&local_690.grp,&local_690.d,&local_690.Q,mbedtls_ctr_drbg_random,&local_a50
                        );
      if (uVar1 == 0) {
        uVar1 = mbedtls_mpi_write_binary(&local_690.Q.X,local_a78,0x20);
        if (uVar1 == 0) {
          puts(" ok");
          printf("  . Setting up server context...");
          fflush(_stdout);
          uVar1 = mbedtls_ecp_group_load(&local_8f8.grp,MBEDTLS_ECP_DP_CURVE25519);
          if (uVar1 != 0) goto LAB_00103374;
          uVar1 = mbedtls_ecdh_gen_public
                            (&local_8f8.grp,&local_8f8.d,&local_8f8.Q,mbedtls_ctr_drbg_random,
                             &local_a50);
          if (uVar1 != 0) goto LAB_001033b0;
          uVar1 = mbedtls_mpi_write_binary(&local_8f8.Q.X,local_a98,0x20);
          if (uVar1 == 0) {
            puts(" ok");
            printf("  . Server reading client key and computing secret...");
            fflush(_stdout);
            uVar1 = mbedtls_mpi_lset(&local_8f8.Qp.Z,1);
            if (uVar1 == 0) {
              uVar1 = mbedtls_mpi_read_binary(&local_8f8.Qp.X,local_a78,0x20);
              if (uVar1 != 0) {
LAB_00103519:
                __format = " failed\n  ! mbedtls_mpi_read_binary returned %d\n";
                goto LAB_001033d6;
              }
              uVar1 = mbedtls_ecdh_compute_shared
                                (&local_8f8.grp,&local_8f8.z,&local_8f8.Qp,&local_8f8.d,
                                 mbedtls_ctr_drbg_random,&local_a50);
              if (uVar1 == 0) {
                puts(" ok");
                printf("  . Client reading server key and computing secret...");
                fflush(_stdout);
                uVar1 = mbedtls_mpi_lset(&local_690.Qp.Z,1);
                if (uVar1 != 0) goto LAB_001034ef;
                uVar1 = mbedtls_mpi_read_binary(&local_690.Qp.X,local_a98,0x20);
                if (uVar1 != 0) goto LAB_00103519;
                uVar1 = mbedtls_ecdh_compute_shared
                                  (&local_690.grp,&local_690.z,&local_690.Qp,&local_690.d,
                                   mbedtls_ctr_drbg_random,&local_a50);
                if (uVar1 == 0) {
                  puts(" ok");
                  iVar2 = 0;
                  printf("  . Checking if both computed secrets are equal...");
                  fflush(_stdout);
                  uVar1 = mbedtls_mpi_cmp_mpi(&local_690.z,&local_8f8.z);
                  if (uVar1 == 0) {
                    puts(" ok");
                    goto LAB_001033e4;
                  }
                }
              }
              __format = " failed\n  ! mbedtls_ecdh_compute_shared returned %d\n";
            }
            else {
LAB_001034ef:
              __format = " failed\n  ! mbedtls_mpi_lset returned %d\n";
            }
            goto LAB_001033d6;
          }
        }
        __format = " failed\n  ! mbedtls_mpi_write_binary returned %d\n";
      }
      else {
LAB_001033b0:
        __format = " failed\n  ! mbedtls_ecdh_gen_public returned %d\n";
      }
    }
    else {
LAB_00103374:
      __format = " failed\n  ! mbedtls_ecp_group_load returned %d\n";
    }
  }
  else {
    __format = " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n";
  }
LAB_001033d6:
  printf(__format,(ulong)uVar1);
  iVar2 = 1;
LAB_001033e4:
  mbedtls_ecdh_free(&local_8f8);
  mbedtls_ecdh_free(&local_690);
  mbedtls_ctr_drbg_free(&local_a50);
  mbedtls_entropy_free(&local_428);
  return iVar2;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret;
    mbedtls_ecdh_context ctx_cli, ctx_srv;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    unsigned char cli_to_srv[32], srv_to_cli[32];
    const char pers[] = "ecdh";
    ((void) argc);
    ((void) argv);

    mbedtls_ecdh_init( &ctx_cli );
    mbedtls_ecdh_init( &ctx_srv );
    mbedtls_ctr_drbg_init( &ctr_drbg );

    /*
     * Initialize random number generation
     */
    mbedtls_printf( "  . Seeding the random number generator..." );
    fflush( stdout );

    mbedtls_entropy_init( &entropy );
    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               sizeof pers ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * Client: inialize context and generate keypair
     */
    mbedtls_printf( "  . Setting up client context..." );
    fflush( stdout );

    ret = mbedtls_ecp_group_load( &ctx_cli.grp, MBEDTLS_ECP_DP_CURVE25519 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecp_group_load returned %d\n", ret );
        goto exit;
    }

    ret = mbedtls_ecdh_gen_public( &ctx_cli.grp, &ctx_cli.d, &ctx_cli.Q,
                                   mbedtls_ctr_drbg_random, &ctr_drbg );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecdh_gen_public returned %d\n", ret );
        goto exit;
    }

    ret = mbedtls_mpi_write_binary( &ctx_cli.Q.X, cli_to_srv, 32 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_write_binary returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * Server: initialize context and generate keypair
     */
    mbedtls_printf( "  . Setting up server context..." );
    fflush( stdout );

    ret = mbedtls_ecp_group_load( &ctx_srv.grp, MBEDTLS_ECP_DP_CURVE25519 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecp_group_load returned %d\n", ret );
        goto exit;
    }

    ret = mbedtls_ecdh_gen_public( &ctx_srv.grp, &ctx_srv.d, &ctx_srv.Q,
                                   mbedtls_ctr_drbg_random, &ctr_drbg );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecdh_gen_public returned %d\n", ret );
        goto exit;
    }

    ret = mbedtls_mpi_write_binary( &ctx_srv.Q.X, srv_to_cli, 32 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_write_binary returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * Server: read peer's key and generate shared secret
     */
    mbedtls_printf( "  . Server reading client key and computing secret..." );
    fflush( stdout );

    ret = mbedtls_mpi_lset( &ctx_srv.Qp.Z, 1 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_lset returned %d\n", ret );
        goto exit;
    }

    ret = mbedtls_mpi_read_binary( &ctx_srv.Qp.X, cli_to_srv, 32 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_read_binary returned %d\n", ret );
        goto exit;
    }

    ret = mbedtls_ecdh_compute_shared( &ctx_srv.grp, &ctx_srv.z,
                                       &ctx_srv.Qp, &ctx_srv.d,
                                       mbedtls_ctr_drbg_random, &ctr_drbg );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecdh_compute_shared returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * Client: read peer's key and generate shared secret
     */
    mbedtls_printf( "  . Client reading server key and computing secret..." );
    fflush( stdout );

    ret = mbedtls_mpi_lset( &ctx_cli.Qp.Z, 1 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_lset returned %d\n", ret );
        goto exit;
    }

    ret = mbedtls_mpi_read_binary( &ctx_cli.Qp.X, srv_to_cli, 32 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_read_binary returned %d\n", ret );
        goto exit;
    }

    ret = mbedtls_ecdh_compute_shared( &ctx_cli.grp, &ctx_cli.z,
                                       &ctx_cli.Qp, &ctx_cli.d,
                                       mbedtls_ctr_drbg_random, &ctr_drbg );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecdh_compute_shared returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * Verification: are the computed secret equal?
     */
    mbedtls_printf( "  . Checking if both computed secrets are equal..." );
    fflush( stdout );

    ret = mbedtls_mpi_cmp_mpi( &ctx_cli.z, &ctx_srv.z );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecdh_compute_shared returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );


exit:

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    mbedtls_ecdh_free( &ctx_srv );
    mbedtls_ecdh_free( &ctx_cli );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

    return( ret != 0 );
}